

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

int mod2dense_flip(mod2dense *m,int row,int col)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    uVar1 = m->col[(uint)col][(uint)row >> 5];
    bVar3 = (uVar1 >> (row & 0x1fU) & 1) == 0;
    uVar2 = uVar1 & ~(1 << (row & 0x1fU));
    if (bVar3) {
      uVar2 = uVar1 | 1 << (row & 0x1fU);
    }
    m->col[(uint)col][(uint)row >> 5] = uVar2;
    return (uint)bVar3;
  }
  fwrite("mod2dense_flip: row or column index out of bounds\n",0x32,1,_stderr);
  exit(1);
}

Assistant:

int mod2dense_flip  
( mod2dense *m, 	/* Matrix to flip element in */
  int row,		/* Row of element (starting with zero) */
  int col		/* Column of element (starting with zero) */
)
{
  mod2word *w;
  int b;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_flip: row or column index out of bounds\n");
    exit(1);
  }

  b = 1 ^ mod2_getbit (m->col[col][row>>mod2_wordsize_shift], 
                       row&mod2_wordsize_mask);

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = b ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
         : mod2_setbit0(*w,row&mod2_wordsize_mask);

  return b;
}